

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void nlohmann::detail::
     from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *j,boolean_t *b)

{
  type_error *__return_storage_ptr__;
  char *pcVar1;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (j->m_type == boolean) {
    *b = (j->m_value).boolean;
    return;
  }
  __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
  if ((ulong)j->m_type < 9) {
    pcVar1 = (&PTR_anon_var_dwarf_c9a32_005c4298)[j->m_type];
  }
  else {
    pcVar1 = "number";
  }
  std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
  std::operator+(&local_38,"type must be boolean, but is ",&local_58);
  type_error::create(__return_storage_ptr__,0x12e,&local_38);
  __cxa_throw(__return_storage_ptr__,&type_error::typeinfo,exception::~exception);
}

Assistant:

void from_json(const BasicJsonType& j, typename BasicJsonType::boolean_t& b) {
	if (JSON_UNLIKELY(not j.is_boolean())) {
		JSON_THROW(type_error::create(302, "type must be boolean, but is " + std::string(j.type_name())));
	}
	b = *j.template get_ptr<const typename BasicJsonType::boolean_t*>();
}